

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_streamsInfo(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
                    int num_coder,coder *coders,int substrm,uint32_t header_crc)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_84 [4];
  long lStack_80;
  uint8_t crc [4];
  file_conflict *file_1;
  long lStack_70;
  uint codec_id;
  file_conflict *file;
  int local_60;
  int r;
  int i;
  int codec_size;
  int fi;
  int numFolders;
  uint8_t codec_buff [8];
  _7zip_conflict *zip;
  coder *coders_local;
  int num_coder_local;
  uint64_t unpack_size_local;
  uint64_t pack_size_local;
  uint64_t offset_local;
  archive_write *a_local;
  
  codec_buff = (uint8_t  [8])a->format_data;
  if (coders->codec == 0) {
    codec_size = (int)*(undefined8 *)((long)codec_buff + 0x20);
  }
  else {
    codec_size = 1;
  }
  a_local._4_4_ = enc_uint64(a,6);
  if ((((-1 < a_local._4_4_) && (a_local._4_4_ = enc_uint64(a,offset), -1 < a_local._4_4_)) &&
      (a_local._4_4_ = enc_uint64(a,(long)codec_size), -1 < a_local._4_4_)) &&
     (a_local._4_4_ = enc_uint64(a,9), -1 < a_local._4_4_)) {
    if (codec_size < 2) {
      iVar1 = enc_uint64(a,pack_size);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    else {
      for (lStack_70 = *(long *)((long)codec_buff + 0xf118);
          (lStack_70 != 0 && (*(long *)(lStack_70 + 0x30) != 0));
          lStack_70 = *(long *)(lStack_70 + 0x18)) {
        iVar1 = enc_uint64(a,*(uint64_t *)(lStack_70 + 0x30));
        if (iVar1 < 0) {
          return iVar1;
        }
      }
    }
    a_local._4_4_ = enc_uint64(a,0);
    if (((-1 < a_local._4_4_) && (a_local._4_4_ = enc_uint64(a,7), -1 < a_local._4_4_)) &&
       ((a_local._4_4_ = enc_uint64(a,0xb), -1 < a_local._4_4_ &&
        ((a_local._4_4_ = enc_uint64(a,(long)codec_size), -1 < a_local._4_4_ &&
         (a_local._4_4_ = enc_uint64(a,0), -1 < a_local._4_4_)))))) {
      for (i = 0; i < codec_size; i = i + 1) {
        iVar1 = enc_uint64(a,(long)num_coder);
        if (iVar1 < 0) {
          return iVar1;
        }
        for (local_60 = 0; local_60 < num_coder; local_60 = local_60 + 1) {
          archive_be64enc(&fi,(ulong)coders[local_60].codec);
          r = 8;
          while ((0 < r && (*(char *)((long)&fi + (long)(8 - r)) == '\0'))) {
            r = r + -1;
          }
          if (r == 0) {
            r = 1;
          }
          if (coders[local_60].prop_size == 0) {
            file._4_4_ = enc_uint64(a,(long)r);
          }
          else {
            file._4_4_ = enc_uint64(a,(long)(int)(r | 0x20));
          }
          if (file._4_4_ < 0) {
            return file._4_4_;
          }
          sVar2 = compress_out(a,(void *)((long)&fi + (long)(int)(8 - (r & 0xfU))),
                               (long)(int)(r & 0xfU),ARCHIVE_Z_RUN);
          if ((int)sVar2 < 0) {
            return (int)sVar2;
          }
          if (coders[local_60].prop_size != 0) {
            iVar1 = enc_uint64(a,coders[local_60].prop_size);
            if (iVar1 < 0) {
              return iVar1;
            }
            sVar2 = compress_out(a,coders[local_60].props,coders[local_60].prop_size,ARCHIVE_Z_RUN);
            if ((int)sVar2 < 0) {
              return (int)sVar2;
            }
          }
        }
      }
      a_local._4_4_ = enc_uint64(a,0xc);
      if (-1 < a_local._4_4_) {
        if (codec_size < 2) {
          iVar1 = enc_uint64(a,unpack_size);
          if (iVar1 < 0) {
            return iVar1;
          }
        }
        else {
          for (lStack_80 = *(long *)((long)codec_buff + 0xf118);
              (lStack_80 != 0 && (*(long *)(lStack_80 + 0x30) != 0));
              lStack_80 = *(long *)(lStack_80 + 0x18)) {
            iVar1 = enc_uint64(a,*(uint64_t *)(lStack_80 + 0x30));
            if (iVar1 < 0) {
              return iVar1;
            }
          }
        }
        if (substrm == 0) {
          iVar1 = enc_uint64(a,10);
          if (iVar1 < 0) {
            return iVar1;
          }
          iVar1 = enc_uint64(a,1);
          if (iVar1 < 0) {
            return iVar1;
          }
          archive_le32enc(local_84,header_crc);
          sVar2 = compress_out(a,local_84,4,ARCHIVE_Z_RUN);
          if ((int)sVar2 < 0) {
            return (int)sVar2;
          }
        }
        a_local._4_4_ = enc_uint64(a,0);
        if ((-1 < a_local._4_4_) &&
           (((substrm == 0 || (a_local._4_4_ = make_substreamsInfo(a,coders), -1 < a_local._4_4_))
            && (a_local._4_4_ = enc_uint64(a,0), -1 < a_local._4_4_)))) {
          a_local._4_4_ = 0;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
make_streamsInfo(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int num_coder, struct coder *coders, int substrm,
    uint32_t header_crc)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	uint8_t codec_buff[8];
	int numFolders, fi;
	int codec_size;
	int i, r;

	if (coders->codec == _7Z_COPY)
		numFolders = (int)zip->total_number_nonempty_entry;
	else
		numFolders = 1;

	/*
	 * Make PackInfo.
	 */
	r = enc_uint64(a, kPackInfo);
	if (r < 0)
		return (r);

	/* Write PackPos. */
	r = enc_uint64(a, offset);
	if (r < 0)
		return (r);

	/* Write NumPackStreams. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Make Size. */
	r = enc_uint64(a, kSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	} else {
		/* Write size. */
		r = enc_uint64(a, pack_size);
		if (r < 0)
			return (r);
	}

	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/*
	 * Make UnPackInfo.
	 */
	r = enc_uint64(a, kUnPackInfo);
	if (r < 0)
		return (r);

	/*
	 * Make Folder.
	 */
	r = enc_uint64(a, kFolder);
	if (r < 0)
		return (r);

	/* Write NumFolders. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Write External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	for (fi = 0; fi < numFolders; fi++) {
		/* Write NumCoders. */
		r = enc_uint64(a, num_coder);
		if (r < 0)
			return (r);

		for (i = 0; i < num_coder; i++) {
			unsigned codec_id = coders[i].codec;

			/* Write Codec flag. */
			archive_be64enc(codec_buff, codec_id);
			for (codec_size = 8; codec_size > 0; codec_size--) {
				if (codec_buff[8 - codec_size])
					break;
			}
			if (codec_size == 0)
				codec_size = 1;
			if (coders[i].prop_size)
				r = enc_uint64(a, codec_size | 0x20);
			else
				r = enc_uint64(a, codec_size);
			if (r < 0)
				return (r);

			/* Write Codec ID. */
			codec_size &= 0x0f;
			r = (int)compress_out(a, &codec_buff[8-codec_size],
				codec_size, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);

			if (coders[i].prop_size) {
				/* Write Codec property size. */
				r = enc_uint64(a, coders[i].prop_size);
				if (r < 0)
					return (r);

				/* Write Codec properties. */
				r = (int)compress_out(a, coders[i].props,
					coders[i].prop_size, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
			}
		}
	}

	/*
	 * Make CodersUnPackSize.
	 */
	r = enc_uint64(a, kCodersUnPackSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}

	} else {
		/* Write UnPackSize. */
		r = enc_uint64(a, unpack_size);
		if (r < 0)
			return (r);
	}

	if (!substrm) {
		uint8_t crc[4];
		/*
		 * Make CRC.
		 */
		r = enc_uint64(a, kCRC);
		if (r < 0)
			return (r);

		/* All are defined */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
		archive_le32enc(crc, header_crc);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	if (substrm) {
		/*
		 * Make SubStreamsInfo.
		 */
		r = make_substreamsInfo(a, coders);
		if (r < 0)
			return (r);
	}


	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}